

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O1

Id __thiscall spv::Builder::makeFpConstant(Builder *this,Id type,double d,bool specConstant)

{
  int iVar1;
  Id IVar2;
  
  iVar1 = getScalarTypeWidth(this,type);
  if ((this->module).idToInstruction.
      super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
      super__Vector_impl_data._M_start[type]->opCode != OpTypeFloat) {
    __assert_fail("isFloatType(type)",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                  ,0x70a,"Id spv::Builder::makeFpConstant(Id, double, bool)");
  }
  if (iVar1 == 0x40) {
    IVar2 = makeDoubleConstant(this,d,specConstant);
    return IVar2;
  }
  if (iVar1 == 0x20) {
    IVar2 = makeFloatConstant(this,(float)d,specConstant);
    return IVar2;
  }
  if (iVar1 == 0x10) {
    IVar2 = makeFloat16Constant(this,(float)d,specConstant);
    return IVar2;
  }
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                ,0x717,"Id spv::Builder::makeFpConstant(Id, double, bool)");
}

Assistant:

Id Builder::makeFpConstant(Id type, double d, bool specConstant)
{
    const int width = getScalarTypeWidth(type);

    assert(isFloatType(type));

    switch (width) {
    case 16:
            return makeFloat16Constant((float)d, specConstant);
    case 32:
            return makeFloatConstant((float)d, specConstant);
    case 64:
            return makeDoubleConstant(d, specConstant);
    default:
            break;
    }

    assert(false);
    return NoResult;
}